

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GED_BasicGroundCombatVehicle.h
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::GED_BasicGroundCombatVehicle::GED_BasicGroundCombatVehicle
          (GED_BasicGroundCombatVehicle *this,GED_BasicGroundCombatVehicle *param_1)

{
  KINT16 KVar1;
  KINT16 KVar2;
  KINT16 KVar3;
  KINT8 KVar4;
  KINT8 KVar5;
  KINT8 KVar6;
  KINT8 KVar7;
  KINT8 KVar8;
  KINT8 KVar9;
  KINT8 KVar10;
  GED_BasicGroundCombatVehicle *param_1_local;
  GED_BasicGroundCombatVehicle *this_local;
  
  GED::GED(&this->super_GED,&param_1->super_GED);
  (this->super_GED).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__GED_BasicGroundCombatVehicle_0032f860;
  KVar1 = param_1->m_i16Offsets[0];
  KVar2 = param_1->m_i16Offsets[1];
  KVar3 = param_1->m_i16Offsets[2];
  this->m_ui16EntityID = param_1->m_ui16EntityID;
  this->m_i16Offsets[0] = KVar1;
  this->m_i16Offsets[1] = KVar2;
  this->m_i16Offsets[2] = KVar3;
  DATA_TYPE::EntityAppearance::EntityAppearance(&this->m_EA,&param_1->m_EA);
  KVar4 = param_1->m_i8Ori[1];
  KVar5 = param_1->m_i8Ori[2];
  KVar6 = param_1->m_i8Spd;
  KVar7 = param_1->m_i8TrrtAz;
  KVar8 = param_1->m_i8GnElv;
  KVar9 = param_1->m_i8TrrtSlwRt;
  KVar10 = param_1->m_i8GnElvRt;
  this->m_i8Ori[0] = param_1->m_i8Ori[0];
  this->m_i8Ori[1] = KVar4;
  this->m_i8Ori[2] = KVar5;
  this->m_i8Spd = KVar6;
  this->m_i8TrrtAz = KVar7;
  this->m_i8GnElv = KVar8;
  this->m_i8TrrtSlwRt = KVar9;
  this->m_i8GnElvRt = KVar10;
  return;
}

Assistant:

class KDIS_EXPORT GED_BasicGroundCombatVehicle : public GED
{
protected:

    KUINT16 m_ui16EntityID;

    KINT16 m_i16Offsets[3];

    EntityAppearance m_EA;

    KINT8 m_i8Ori[3];

    KINT8 m_i8Spd;

    KINT8 m_i8TrrtAz;

    KINT8 m_i8GnElv;

    KINT8 m_i8TrrtSlwRt;

    KINT8 m_i8GnElvRt;

public:

    static const KUINT16 GED_BASIC_GROUND_COMBAT_VEHICLE_SIZE = 20;

    GED_BasicGroundCombatVehicle();

    GED_BasicGroundCombatVehicle(KDataStream &stream) noexcept(false);

    GED_BasicGroundCombatVehicle( KUINT16 ID, KINT16 XOffset, KINT16 YOffset, KINT16 ZOffset, const EntityAppearance & EA,
                                  KINT8 Psi, KINT8 Theta, KINT8 Phi, KINT8 Speed, KINT8 TurretAzimuth, KINT8 GunElevation,
                                  KINT8 TurretSlewRate, KINT8 GunElevationRate );

    virtual ~GED_BasicGroundCombatVehicle();

    //************************************
    // FullName:    KDIS::DATA_TYPE::GED_BasicGroundCombatVehicle::GetGroupedEntityCategory
    // Description: Identifies the derived GED class.
    //              Not part of the DIS PDU.
    //************************************
    virtual KDIS::DATA_TYPE::ENUMS::GroupedEntityCategory GetGroupedEntityCategory() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::GED_BasicGroundCombatVehicle::GetLength
    // Description: Returns size of the GED in octets.
    //              Not part of the DIS PDU.
    //************************************
    virtual KUINT8 GetLength() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::GED_BasicGroundCombatVehicle::SetEntityID
    //              KDIS::DATA_TYPE::GED_BasicGroundCombatVehicle::GetEntityID
    // Description: Entity identifier unique within the group.
    //              The Site Identifier and Application Identifiers shall be the same as
    //              those designated in the Group Entity ID field.
    // Parameter:   KUINT16 ID, void
    //************************************
    void SetEntityID( KUINT16 ID );
    KUINT16 GetEntityID() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::GED_BasicGroundCombatVehicle::SetEntityLocation
    //              KDIS::DATA_TYPE::GED_BasicGroundCombatVehicle::SetEntityLocationXOffset
    //              KDIS::DATA_TYPE::GED_BasicGroundCombatVehicle::SetEntityLocationYOffset
    //              KDIS::DATA_TYPE::GED_BasicGroundCombatVehicle::SetEntityLocationZOffset
    //              KDIS::DATA_TYPE::GED_BasicGroundCombatVehicle::GetEntityLocationXOffset
    //              KDIS::DATA_TYPE::GED_BasicGroundCombatVehicle::GetEntityLocationYOffset
    //              KDIS::DATA_TYPE::GED_BasicGroundCombatVehicle::GetEntityLocationZOffset
    // Description: Location of the grouped entity specified by a set of three offsets.
    //              Determined by the difference, in meters, of the grouped entity from the Group Reference Point.
    // Parameter:   KINT16, void
    //************************************
    void SetEntityLocation( KINT16 XOffset, KINT16 YOffset, KINT16 ZOffset );
    void SetEntityLocation( KINT16 Offsets[3] );
    void SetEntityLocationXOffset( KINT16 X );
    void SetEntityLocationYOffset( KINT16 Y );
    void SetEntityLocationZOffset( KINT16 Z );
    KINT16 GetEntityLocationXOffset() const;
    KINT16 GetEntityLocationYOffset() const;
    KINT16 GetEntityLocationZOffset() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::GED_BasicGroundCombatVehicle::SetEntityAppearance
    //              KDIS::DATA_TYPE::GED_BasicGroundCombatVehicle::GetEntityAppearance
    // Description: Entity appearance bit field accessors/mutator
    // Parameter:   const EntityAppearance & EA, void
    //************************************
    void SetEntityAppearance( const EntityAppearance & EA );
    const EntityAppearance & GetEntityAppearance() const;
    EntityAppearance & GetEntityAppearance();

    //************************************
    //              GetEntityOrientationPhi
    // FullName:    KDIS::DATA_TYPE::GED_BasicGroundCombatVehicle::SetEntityOrientation
    //              KDIS::DATA_TYPE::GED_BasicGroundCombatVehicle::SetEntityOrientationPsi
    //              KDIS::DATA_TYPE::GED_BasicGroundCombatVehicle::SetEntityOrientationTheta
    //              KDIS::DATA_TYPE::GED_BasicGroundCombatVehicle::SetEntityOrientationPhi
    //              KDIS::DATA_TYPE::GED_BasicGroundCombatVehicle::GetEntityOrientationPsi
    //              KDIS::DATA_TYPE::GED_BasicGroundCombatVehicle::GetEntityOrientationTheta
    //              KDIS::DATA_TYPE::GED_BasicGroundCombatVehicle::GetEntityOrientationPhi
    // Description: Entity orientation in euler angles, psi, theta and phi, in 25 milliradian increments.
    // Parameter:   KINT8, void
    //************************************
    void SetEntityOrientation( KINT8 Psi, KINT8 Theta, KINT8 Phi );
    void SetEntityOrientation( KINT8 Ori[3] );
    void SetEntityOrientationPsi( KINT8 P );
    void SetEntityOrientationTheta( KINT8 T );
    void SetEntityOrientationPhi( KINT8 P );
    KINT8 GetEntityOrientationPsi() const;
    KINT8 GetEntityOrientationTheta() const;
    KINT8 GetEntityOrientationPhi() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::GED_BasicGroundCombatVehicle::SetSpeed
    //              KDIS::DATA_TYPE::GED_BasicGroundCombatVehicle::GetSpeed
    // Description: Signed magnitude value of the entity�s absolute velocity vector.
    //              A negative value shall indicate that the entity is moving backwards.
    //              Measured in Meters Per Secound (m/s).
    // Parameter:   KINT8 S, void
    //************************************
    void SetSpeed( KINT8 S );
    KINT8 GetSpeed() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::GED_BasicGroundCombatVehicle::SetTurretAzimuth
    //              KDIS::DATA_TYPE::GED_BasicGroundCombatVehicle::GetTurretAzimuth
    // Description: Turret azimuth specified in 25 milliradian increments.
    // Parameter:   KINT8 T, void
    //************************************
    void SetTurretAzimuth( KINT8 T );
    KINT8 GetTurretAzimuth() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::GED_BasicGroundCombatVehicle::SetGunElevation
    //              KDIS::DATA_TYPE::GED_BasicGroundCombatVehicle::GetGunElevation
    // Description: Gun elevation specified in 25 milliradian increments.
    // Parameter:   KINT8 G, void
    //************************************
    void SetGunElevation( KINT8 G );
    KINT8 GetGunElevation() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::GED_BasicGroundCombatVehicle::SetTurretSlewRate
    //              KDIS::DATA_TYPE::GED_BasicGroundCombatVehicle::GetTurretSlewRate
    // Description: Turret slew rate specified in 25 milliradian per secound increments.
    // Parameter:   KINT8 T, void
    //************************************
    void SetTurretSlewRate( KINT8 T );
    KINT8 GetTurretSlewRate() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::GED_BasicGroundCombatVehicle::SetGunElevationRate
    //              KDIS::DATA_TYPE::GED_BasicGroundCombatVehicle::GetGunElevationRate
    // Description: Gun elevation rate specified in 25 milliradian per secound increments.
    // Parameter:   KINT8 G, void
    //************************************
    void SetGunElevationRate( KINT8 G );
    KINT8 GetGunElevationRate() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::GED_BasicGroundCombatVehicle::GetAsString
    // Description: Returns a string representation
    //************************************
    virtual KString GetAsString() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::GED_BasicGroundCombatVehicle::Decode
    // Description: Convert From Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual void Decode(KDataStream &stream) noexcept(false);

    //************************************
    // FullName:    KDIS::DATA_TYPE::GED_BasicGroundCombatVehicle::Encode
    // Description: Convert To Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual KDataStream Encode() const;
    virtual void Encode( KDataStream & stream ) const;

    KBOOL operator == ( const GED_BasicGroundCombatVehicle & Value ) const;
    KBOOL operator != ( const GED_BasicGroundCombatVehicle & Value ) const;
}